

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Histogram(HistogramForm2 Histogram)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image image;
  uint8_t intensity;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  uint8_t in_stack_ffffffffffffff26;
  uint8_t in_stack_ffffffffffffff27;
  uint32_t in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint32_t in_stack_ffffffffffffff44;
  value_type vVar6;
  uint32_t in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff4f;
  byte bVar7;
  ImageTemplate<unsigned_char> local_88 [2];
  ImageTemplate<unsigned_char> local_38;
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff27,in_stack_ffffffffffffff26);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             (Image *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d6d65);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d6d74);
  (*local_8)(&local_38,local_88);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
  bVar7 = false;
  if (sVar4 == 0x100) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                        (ulong)local_9);
    vVar6 = *pvVar5;
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    bVar7 = false;
    if (vVar6 == uVar1 * uVar2) {
      in_stack_ffffffffffffff30 = local_88;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffff18._M_current);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffff18._M_current);
      __first._M_current._6_1_ = in_stack_ffffffffffffff26;
      __first._M_current._0_6_ = in_stack_ffffffffffffff20;
      __first._M_current._7_1_ = in_stack_ffffffffffffff27;
      uVar3 = std::
              accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                        (__first,in_stack_ffffffffffffff18,0);
      uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
      bVar7 = uVar3 == uVar1 * uVar2;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d6e9d);
  return (bool)(bVar7 & 1);
}

Assistant:

bool form2_Histogram(HistogramForm2 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        std::vector < uint32_t > histogram;
        Histogram( image, histogram );

        return histogram.size() == 256u && histogram[intensity] == image.width() * image.height() &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * image.height();
    }